

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,
          initializer_list<int> *Nsimplex,Filtration_value *filtration)

{
  Filtration_value FVar1;
  long lVar2;
  int *__first;
  long lVar3;
  int *piVar4;
  Filtration_value *filt;
  int iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  undefined8 *puVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  const_iterator __position;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_bool>
  pVar9;
  
  lVar2 = *(long *)(filtration + 2);
  if (lVar2 == 0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    __first = *(int **)filtration;
    if ((char)in_FS_OFFSET[-9] == '\0') {
      in_FS_OFFSET[-10] = 0;
      in_FS_OFFSET[-0xc] = 0;
      in_FS_OFFSET[-0xb] = 0;
      __cxa_thread_atexit(std::vector<int,_std::allocator<int>_>::~vector,*in_FS_OFFSET + -0x60,
                          &__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -9) = 1;
    }
    lVar3 = *in_FS_OFFSET;
    piVar4 = (int *)in_FS_OFFSET[-0xc];
    __position._M_current = (int *)in_FS_OFFSET[-0xb];
    if ((int *)in_FS_OFFSET[-0xb] != piVar4) {
      in_FS_OFFSET[-0xb] = (long)piVar4;
      __position._M_current = piVar4;
    }
    std::vector<int,std::allocator<int>>::insert<int_const*,void>
              ((vector<int,std::allocator<int>> *)(lVar3 + -0x60),__position,__first,__first + lVar2
              );
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (in_FS_OFFSET[-0xc],in_FS_OFFSET[-0xb]);
    _Var6 = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0xc],in_FS_OFFSET[-0xb]);
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)(lVar3 + -0x60),(const_iterator)_Var6._M_current
               ,(int *)in_FS_OFFSET[-0xb]);
    _Var6._M_current = (int *)in_FS_OFFSET[-0xc];
    filt = (Filtration_value *)in_FS_OFFSET[-0xb];
    _Var8._M_current = _Var6._M_current;
    while ((Filtration_value *)_Var8._M_current != filt) {
      FVar1 = (Filtration_value)*_Var8._M_current;
      _Var8._M_current = (int *)((Filtration_value *)_Var8._M_current + 1);
      if (FVar1 == *(Filtration_value *)&Nsimplex[3]._M_len) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
    }
    iVar5 = (int)((ulong)((long)filt - (long)_Var6._M_current) >> 2) + -1;
    if (iVar5 < *(int *)&Nsimplex[8]._M_array) {
      iVar5 = *(int *)&Nsimplex[8]._M_array;
    }
    *(int *)&Nsimplex[8]._M_array = iVar5;
    pVar9 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (this,(Siblings *)Nsimplex,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (Nsimplex + 4),_Var6,filt);
    filtration = pVar9._8_8_;
  }
  pVar9._8_8_ = filtration;
  pVar9.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)this;
  return pVar9;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }